

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O3

void __thiscall btMultiBodyDynamicsWorld::applyGravity(btMultiBodyDynamicsWorld *this)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  btMultiBody *this_00;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  btScalar bVar11;
  btVector3 local_38;
  
  btDiscreteDynamicsWorld::applyGravity(&this->super_btDiscreteDynamicsWorld);
  CProfileManager::Start_Profile("btMultiBody addGravity");
  iVar7 = (this->m_multiBodies).m_size;
  if (0 < iVar7) {
    lVar9 = 0;
    do {
      this_00 = (this->m_multiBodies).m_data[lVar9];
      if (this_00->m_baseCollider == (btMultiBodyLinkCollider *)0x0) {
        bVar10 = false;
      }
      else {
        bVar10 = *(int *)(this_00->m_baseCollider + 0xec) == 2;
      }
      iVar5 = (this_00->m_links).m_size;
      if (0 < (long)iVar5) {
        lVar8 = 0;
        do {
          lVar6 = *(long *)((long)((this_00->m_links).m_data)->m_jointTorque + lVar8 + 0x1c);
          if (lVar6 != 0) {
            bVar10 = (bool)(bVar10 | *(int *)(lVar6 + 0xec) == 2);
          }
          lVar8 = lVar8 + 600;
        } while ((long)iVar5 * 600 - lVar8 != 0);
      }
      if (!bVar10) {
        fVar1 = this_00->m_baseMass;
        fVar2 = (this->super_btDiscreteDynamicsWorld).m_gravity.m_floats[2];
        uVar3 = *(undefined8 *)(this->super_btDiscreteDynamicsWorld).m_gravity.m_floats;
        uVar4 = *(undefined8 *)(this_00->m_baseForce).m_floats;
        *(ulong *)(this_00->m_baseForce).m_floats =
             CONCAT44((float)((ulong)uVar4 >> 0x20) + fVar1 * (float)((ulong)uVar3 >> 0x20),
                      (float)uVar4 + fVar1 * (float)uVar3);
        (this_00->m_baseForce).m_floats[2] = fVar2 * fVar1 + (this_00->m_baseForce).m_floats[2];
        if (0 < iVar5) {
          iVar7 = 0;
          do {
            bVar11 = btMultiBody::getLinkMass(this_00,iVar7);
            uVar3 = *(undefined8 *)(this->super_btDiscreteDynamicsWorld).m_gravity.m_floats;
            local_38.m_floats[1] = bVar11 * (float)((ulong)uVar3 >> 0x20);
            local_38.m_floats[0] = bVar11 * (float)uVar3;
            local_38.m_floats[2] =
                 bVar11 * (this->super_btDiscreteDynamicsWorld).m_gravity.m_floats[2];
            local_38.m_floats[3] = 0.0;
            btMultiBody::addLinkForce(this_00,iVar7,&local_38);
            iVar7 = iVar7 + 1;
          } while (iVar7 < (this_00->m_links).m_size);
          iVar7 = (this->m_multiBodies).m_size;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar7);
  }
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void btMultiBodyDynamicsWorld::applyGravity()
{
        btDiscreteDynamicsWorld::applyGravity();
#ifdef BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
        BT_PROFILE("btMultiBody addGravity");
        for (int i=0;i<this->m_multiBodies.size();i++)
        {
                btMultiBody* bod = m_multiBodies[i];

                bool isSleeping = false;

                if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
                {
                        isSleeping = true;
                }
                for (int b=0;b<bod->getNumLinks();b++)
                {
                        if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
                                isSleeping = true;
                }

                if (!isSleeping)
                {
                        bod->addBaseForce(m_gravity * bod->getBaseMass());

                        for (int j = 0; j < bod->getNumLinks(); ++j)
                        {
                                bod->addLinkForce(j, m_gravity * bod->getLinkMass(j));
                        }
                }//if (!isSleeping)
        }
#endif //BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
}